

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.h
# Opt level: O2

void __thiscall wallet::COutput::ApplyBumpFee(COutput *this,CAmount bump_fee)

{
  long lVar1;
  long lVar2;
  uint __line;
  long *plVar3;
  char *__assertion;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (bump_fee < 0) {
    __assertion = "bump_fee >= 0";
    __line = 0x72;
  }
  else {
    this->ancestor_bump_fees = bump_fee;
    if ((this->fee).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged != false) {
      (this->fee).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value =
           (this->fee).super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload._M_value + bump_fee;
      lVar2 = (this->txout).nValue;
      plVar3 = std::optional<long>::value(&this->fee);
      (this->effective_value).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value = lVar2 - *plVar3;
      (this->effective_value).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged = true;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    __assertion = "fee";
    __line = 0x74;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.h"
                ,__line,"void wallet::COutput::ApplyBumpFee(CAmount)");
}

Assistant:

void ApplyBumpFee(CAmount bump_fee)
    {
        assert(bump_fee >= 0);
        ancestor_bump_fees = bump_fee;
        assert(fee);
        *fee += bump_fee;
        // Note: assert(effective_value - bump_fee == nValue - fee.value());
        effective_value = txout.nValue - fee.value();
    }